

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O1

DdNode * Cudd_PrioritySelect(DdManager *dd,DdNode *R,DdNode **x,DdNode **y,DdNode **z,DdNode *Pi,
                            int n,DD_PRFP Pifunc)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *f;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *unaff_RBP;
  ulong uVar8;
  
  bVar3 = false;
  bVar2 = false;
  if (z == (DdNode **)0x0) {
    if (Pi != (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    unaff_RBP = (DdNode *)(ulong)(uint)n;
    z = (DdNode **)malloc((long)n << 3);
    if (z == (DdNode **)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      return (DdNode *)0x0;
    }
    if (n < 1) {
      bVar2 = true;
    }
    else {
      unaff_RBP = (DdNode *)0x0;
      uVar8 = 0;
      do {
        bVar2 = true;
        if (0x7ffffffd < dd->size) goto LAB_00787fba;
        pDVar7 = cuddUniqueInter(dd,dd->size,dd->one,(DdNode *)((ulong)dd->one ^ 1));
        z[uVar8] = pDVar7;
        if (pDVar7 == (DdNode *)0x0) goto LAB_00787fba;
        uVar8 = uVar8 + 1;
        bVar2 = true;
      } while ((uint)n != uVar8);
    }
  }
  if (Pi == (DdNode *)0x0) {
    Pi = (*Pifunc)(dd,n,x,y,z);
    if (Pi == (DdNode *)0x0) {
LAB_00787fba:
      pDVar5 = (DdNode *)0x0;
      pDVar7 = (DdNode *)0x0;
      Pi = (DdNode *)0x0;
      bVar3 = false;
      goto LAB_00787fdc;
    }
    piVar1 = (int *)(((ulong)Pi & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    bVar3 = true;
  }
  pDVar7 = dd->one;
  piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  uVar8 = (ulong)(uint)n;
  do {
    if ((int)uVar8 < 1) {
      f = Cudd_bddSwapVariables(dd,R,y,z,n);
      if (f == (DdNode *)0x0) goto LAB_00787f32;
      piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar6 = Cudd_bddAndAbstract(dd,f,Pi,pDVar7);
      if (pDVar6 == (DdNode *)0x0) {
LAB_00787fca:
        pDVar5 = (DdNode *)0x0;
      }
      else {
        piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,f);
        pDVar5 = Cudd_bddAnd(dd,R,(DdNode *)((ulong)pDVar6 ^ 1));
        f = pDVar6;
        if (pDVar5 == (DdNode *)0x0) goto LAB_00787fca;
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
      }
      Cudd_RecursiveDeref(dd,f);
      goto LAB_00787fdc;
    }
    pDVar5 = Cudd_bddAnd(dd,z[uVar8 - 1],pDVar7);
    if (pDVar5 == (DdNode *)0x0) {
      iVar4 = 5;
    }
    else {
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,pDVar7);
      iVar4 = 0;
      unaff_RBP = pDVar5;
      pDVar7 = pDVar5;
    }
    uVar8 = uVar8 - 1;
  } while (iVar4 == 0);
  if (iVar4 != 5) {
    return unaff_RBP;
  }
LAB_00787f32:
  pDVar5 = (DdNode *)0x0;
LAB_00787fdc:
  if (pDVar7 != (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,pDVar7);
  }
  if (bVar2) {
    free(z);
  }
  if (bVar3) {
    Cudd_RecursiveDeref(dd,Pi);
  }
  if (pDVar5 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  return pDVar5;
}

Assistant:

DdNode *
Cudd_PrioritySelect(
  DdManager * dd /* manager */,
  DdNode * R /* BDD of the relation */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */,
  DdNode ** z /* array of z variables (optional: may be NULL) */,
  DdNode * Pi /* BDD of the priority function (optional: may be NULL) */,
  int  n /* size of x, y, and z */,
  DD_PRFP Pifunc /* function used to build Pi if it is NULL */)
{
    DdNode *res = NULL;
    DdNode *zcube = NULL;
    DdNode *Rxz, *Q;
    int createdZ = 0;
    int createdPi = 0;
    int i;

    /* Create z variables if needed. */
    if (z == NULL) {
        if (Pi != NULL) return(NULL);
        z = ABC_ALLOC(DdNode *,n);
        if (z == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        createdZ = 1;
        for (i = 0; i < n; i++) {
            if (dd->size >= (int) CUDD_MAXINDEX - 1) goto endgame;
            z[i] = cuddUniqueInter(dd,dd->size,dd->one,Cudd_Not(dd->one));
            if (z[i] == NULL) goto endgame;
        }
    }

    /* Create priority function BDD if needed. */
    if (Pi == NULL) {
        Pi = Pifunc(dd,n,x,y,z);
        if (Pi == NULL) goto endgame;
        createdPi = 1;
        cuddRef(Pi);
    }

    /* Initialize abstraction cube. */
    zcube = DD_ONE(dd);
    cuddRef(zcube);
    for (i = n - 1; i >= 0; i--) {
        DdNode *tmpp;
        tmpp = Cudd_bddAnd(dd,z[i],zcube);
        if (tmpp == NULL) goto endgame;
        cuddRef(tmpp);
        Cudd_RecursiveDeref(dd,zcube);
        zcube = tmpp;
    }

    /* Compute subset of (x,y) pairs. */
    Rxz = Cudd_bddSwapVariables(dd,R,y,z,n);
    if (Rxz == NULL) goto endgame;
    cuddRef(Rxz);
    Q = Cudd_bddAndAbstract(dd,Rxz,Pi,zcube);
    if (Q == NULL) {
        Cudd_RecursiveDeref(dd,Rxz);
        goto endgame;
    }
    cuddRef(Q);
    Cudd_RecursiveDeref(dd,Rxz);
    res = Cudd_bddAnd(dd,R,Cudd_Not(Q));
    if (res == NULL) {
        Cudd_RecursiveDeref(dd,Q);
        goto endgame;
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd,Q);

endgame:
    if (zcube != NULL) Cudd_RecursiveDeref(dd,zcube);
    if (createdZ) {
        ABC_FREE(z);
    }
    if (createdPi) {
        Cudd_RecursiveDeref(dd,Pi);
    }
    if (res != NULL) cuddDeref(res);
    return(res);

}